

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibScl.c
# Opt level: O3

void Abc_SclWriteLiberty(char *pFileName,SC_Lib *p)

{
  float fVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  FILE *__stream;
  char *pcVar8;
  ulong uVar9;
  long lVar10;
  size_t sVar11;
  long lVar12;
  
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    pcVar8 = "Cannot open text file \"%s\" for writing.\n";
    goto LAB_003ee16b;
  }
  pcVar8 = Extra_TimeStamp();
  fprintf(__stream,"/* This Liberty file was generated by ABC on %s */\n",pcVar8);
  fprintf(__stream,"/* The original unabridged library came from file \"%s\".*/\n\n",p->pFileName);
  fprintf(__stream,"library(%s) {\n\n",p->pName);
  if ((p->default_wire_load != (char *)0x0) && (*p->default_wire_load != '\0')) {
    fprintf(__stream,"  default_wire_load : \"%s\";\n");
  }
  if ((p->default_wire_load_sel != (char *)0x0) && (*p->default_wire_load_sel != '\0')) {
    fprintf(__stream,"  default_wire_load_selection : \"%s\";\n");
  }
  fVar1 = p->default_max_out_slew;
  if ((fVar1 != -1.0) || (NAN(fVar1))) {
    fprintf(__stream,"  default_max_transition : %f;\n",(double)fVar1);
  }
  switch(p->unit_time) {
  case 9:
    pcVar8 = "  time_unit : \"1ns\";\n";
    goto LAB_003eda63;
  case 10:
    pcVar8 = "  time_unit : \"100ps\";\n";
    sVar11 = 0x17;
    break;
  case 0xb:
    pcVar8 = "  time_unit : \"10ps\";\n";
    sVar11 = 0x16;
    break;
  case 0xc:
    pcVar8 = "  time_unit : \"1ps\";\n";
LAB_003eda63:
    sVar11 = 0x15;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLibScl.c"
                  ,0x2cd,"void Abc_SclWriteLibraryText(FILE *, SC_Lib *)");
  }
  fwrite(pcVar8,sVar11,1,__stream);
  pcVar8 = "ff";
  if (p->unit_cap_snd == 0xc) {
    pcVar8 = "pf";
  }
  fprintf(__stream,"  capacitive_load_unit(%.1f,%s);\n",(double)p->unit_cap_fst,pcVar8);
  fputc(10,__stream);
  if (0 < (p->vWireLoads).nSize) {
    lVar10 = 0;
    do {
      puVar2 = (undefined8 *)(p->vWireLoads).pArray[lVar10];
      fprintf(__stream,"  wire_load(\"%s\") {\n",*puVar2);
      fprintf(__stream,"    capacitance : %f;\n",(double)*(float *)(puVar2 + 1));
      fprintf(__stream,"    slope : %f;\n",(double)*(float *)((long)puVar2 + 0xc));
      if (0 < *(int *)((long)puVar2 + 0x14)) {
        lVar12 = 0;
        do {
          if (*(int *)((long)puVar2 + 0x24) <= lVar12) goto LAB_003ee183;
          fprintf(__stream,"    fanout_length( %d, %f );\n",
                  (double)*(float *)(puVar2[5] + lVar12 * 4),
                  (ulong)*(uint *)(puVar2[3] + lVar12 * 4));
          lVar12 = lVar12 + 1;
        } while (lVar12 < *(int *)((long)puVar2 + 0x14));
      }
      fwrite("  }\n\n",5,1,__stream);
      lVar10 = lVar10 + 1;
    } while (lVar10 < (p->vWireLoads).nSize);
  }
  if (0 < (p->vWireLoadSels).nSize) {
    lVar10 = 0;
    do {
      puVar2 = (undefined8 *)(p->vWireLoadSels).pArray[lVar10];
      fprintf(__stream,"  wire_load_selection(\"%s\") {\n",*puVar2);
      if (0 < *(int *)((long)puVar2 + 0xc)) {
        lVar12 = 0;
        do {
          if (*(int *)((long)puVar2 + 0x1c) <= lVar12) {
LAB_003ee183:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecFlt.h"
                          ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
          }
          if (*(int *)((long)puVar2 + 0x2c) <= lVar12) goto LAB_003ee1a2;
          fprintf(__stream,"    wire_load_from_area( %f, %f, %s );\n",
                  (double)*(float *)(puVar2[2] + lVar12 * 4),
                  (double)*(float *)(puVar2[4] + lVar12 * 4),*(undefined8 *)(puVar2[6] + lVar12 * 8)
                 );
          lVar12 = lVar12 + 1;
        } while (lVar12 < *(int *)((long)puVar2 + 0xc));
      }
      fwrite("  }\n\n",5,1,__stream);
      lVar10 = lVar10 + 1;
    } while (lVar10 < (p->vWireLoadSels).nSize);
  }
  iVar6 = (p->vCells).nSize;
  if (0 < iVar6) {
    lVar10 = 0;
    do {
      puVar2 = (undefined8 *)(p->vCells).pArray[lVar10];
      if ((*(int *)(puVar2 + 2) == 0) && (*(int *)((long)puVar2 + 0x14) == 0)) {
        fputc(10,__stream);
        fprintf(__stream,"  cell(%s) {\n",*puVar2);
        fprintf(__stream,"    /*  n_inputs = %d  n_outputs = %d */\n",(ulong)*(uint *)(puVar2 + 8),
                (ulong)*(uint *)((long)puVar2 + 0x44));
        fprintf(__stream,"    area : %f;\n",(double)*(float *)(puVar2 + 3));
        fprintf(__stream,"    cell_leakage_power : %f;\n",(double)*(float *)((long)puVar2 + 0x1c));
        fprintf(__stream,"    drive_strength : %d;\n",(ulong)*(uint *)(puVar2 + 5));
        uVar7 = *(uint *)(puVar2 + 8);
        if (0 < (int)uVar7) {
          lVar12 = 0;
          do {
            if (*(int *)((long)puVar2 + 0x34) <= lVar12) goto LAB_003ee1a2;
            puVar3 = *(undefined8 **)(puVar2[7] + lVar12 * 8);
            if (*(int *)(puVar3 + 1) != 1) {
              __assert_fail("pPin->dir == sc_dir_Input",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLibScl.c"
                            ,0x2fc,"void Abc_SclWriteLibraryText(FILE *, SC_Lib *)");
            }
            fprintf(__stream,"    pin(%s) {\n",*puVar3);
            fprintf(__stream,"      direction : %s;\n","input");
            fprintf(__stream,"      fall_capacitance : %f;\n",
                    (double)*(float *)((long)puVar3 + 0x14));
            fprintf(__stream,"      rise_capacitance : %f;\n",(double)*(float *)(puVar3 + 2));
            fwrite("    }\n",6,1,__stream);
            lVar12 = lVar12 + 1;
            uVar7 = *(uint *)(puVar2 + 8);
          } while (lVar12 < (int)uVar7);
        }
        if ((int)uVar7 < *(int *)((long)puVar2 + 0x34)) {
          if ((int)uVar7 < 0) {
LAB_003ee1a2:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          uVar9 = (ulong)uVar7;
          do {
            puVar3 = *(undefined8 **)(puVar2[7] + uVar9 * 8);
            if (*(int *)(puVar3 + 1) != 2) {
              __assert_fail("pPin->dir == sc_dir_Output",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLibScl.c"
                            ,0x308,"void Abc_SclWriteLibraryText(FILE *, SC_Lib *)");
            }
            fprintf(__stream,"    pin(%s) {\n",*puVar3);
            fprintf(__stream,"      direction : %s;\n","output");
            fprintf(__stream,"      max_capacitance : %f;\n",(double)*(float *)(puVar3 + 4));
            fprintf(__stream,"      max_transition : %f;\n",(double)*(float *)((long)puVar3 + 0x24))
            ;
            pcVar8 = (char *)puVar3[5];
            if (pcVar8 == (char *)0x0) {
              pcVar8 = "?";
            }
            fprintf(__stream,"      function : \"%s\";\n",pcVar8);
            fwrite("      /*  truth table = ",0x18,1,__stream);
            Extra_PrintHex((FILE *)__stream,(uint *)puVar3[7],*(int *)(puVar2 + 8));
            fwrite("  */\n",5,1,__stream);
            iVar6 = *(int *)((long)puVar3 + 0x44);
            if (iVar6 != *(int *)(puVar2 + 8)) {
              __assert_fail("Vec_PtrSize(&pPin->vRTimings) == pCell->n_inputs",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLibScl.c"
                            ,0x313,"void Abc_SclWriteLibraryText(FILE *, SC_Lib *)");
            }
            if (0 < iVar6) {
              lVar12 = 0;
              do {
                puVar4 = *(undefined8 **)(puVar3[9] + lVar12 * 8);
                if (*(int *)((long)puVar4 + 0xc) != 0) {
                  if (*(int *)((long)puVar4 + 0xc) != 1) {
                    __assert_fail("Vec_PtrSize(&pRTime->vTimings) == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLibScl.c"
                                  ,0x335,"void Abc_SclWriteLibraryText(FILE *, SC_Lib *)");
                  }
                  lVar5 = *(long *)puVar4[2];
                  fwrite("      timing() {\n",0x11,1,__stream);
                  fprintf(__stream,"        related_pin : \"%s\"\n",*puVar4);
                  iVar6 = *(int *)(lVar5 + 8);
                  if (iVar6 == 3) {
                    sVar11 = 0x22;
                    pcVar8 = "        timing_sense : non_unate;\n";
                  }
                  else if (iVar6 == 2) {
                    sVar11 = 0x27;
                    pcVar8 = "        timing_sense : negative_unate;\n";
                  }
                  else {
                    if (iVar6 != 1) {
                      __assert_fail("0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclLibScl.c"
                                    ,0x321,"void Abc_SclWriteLibraryText(FILE *, SC_Lib *)");
                    }
                    sVar11 = 0x27;
                    pcVar8 = "        timing_sense : positive_unate;\n";
                  }
                  fwrite(pcVar8,sVar11,1,__stream);
                  fwrite("        cell_rise() {\n",0x16,1,__stream);
                  Abc_SclWriteSurfaceText((FILE *)__stream,(SC_Surface *)(lVar5 + 0x18));
                  fwrite("        }\n",10,1,__stream);
                  fwrite("        cell_fall() {\n",0x16,1,__stream);
                  Abc_SclWriteSurfaceText((FILE *)__stream,(SC_Surface *)(lVar5 + 200));
                  fwrite("        }\n",10,1,__stream);
                  fwrite("        rise_transition() {\n",0x1c,1,__stream);
                  Abc_SclWriteSurfaceText((FILE *)__stream,(SC_Surface *)(lVar5 + 0x178));
                  fwrite("        }\n",10,1,__stream);
                  fwrite("        fall_transition() {\n",0x1c,1,__stream);
                  Abc_SclWriteSurfaceText((FILE *)__stream,(SC_Surface *)(lVar5 + 0x228));
                  fwrite("        }\n",10,1,__stream);
                  fwrite("      }\n",8,1,__stream);
                  iVar6 = *(int *)((long)puVar3 + 0x44);
                }
                lVar12 = lVar12 + 1;
              } while (lVar12 < iVar6);
            }
            fwrite("    }\n",6,1,__stream);
            uVar9 = uVar9 + 1;
          } while ((int)uVar9 < *(int *)((long)puVar2 + 0x34));
        }
        fwrite("  }\n",4,1,__stream);
        iVar6 = (p->vCells).nSize;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < iVar6);
  }
  fwrite("}\n\n",3,1,__stream);
  fclose(__stream);
  pcVar8 = "Dumped internal library into Liberty file \"%s\".\n";
LAB_003ee16b:
  printf(pcVar8,pFileName);
  return;
}

Assistant:

void Abc_SclWriteLiberty( char * pFileName, SC_Lib * p )
{
    FILE * pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
        printf( "Cannot open text file \"%s\" for writing.\n", pFileName );
    else
    {
        Abc_SclWriteLibraryText( pFile, p );
        fclose( pFile );
        printf( "Dumped internal library into Liberty file \"%s\".\n", pFileName );
    }
}